

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool.cpp
# Opt level: O0

void createToken(path *keyFile)

{
  bool bVar1;
  runtime_error *prVar2;
  ostream *poVar3;
  PublicKey *pPVar4;
  pointer_const_type this;
  ulong uVar5;
  ulong uVar6;
  PublicKey *in_RCX;
  string local_138 [32];
  int local_118;
  undefined4 local_114;
  int i;
  int len;
  string tokenStr;
  KeyType local_cc;
  undefined1 local_c8 [8];
  optional<jbcoin::ValidatorToken> token;
  undefined1 local_70 [8];
  ValidatorKeys keys;
  path *keyFile_local;
  
  keys._88_8_ = keyFile;
  jbcoin::ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)local_70,keyFile);
  bVar1 = jbcoin::ValidatorKeys::revoked((ValidatorKeys *)local_70);
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Validator keys have been revoked.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_cc = secp256k1;
  jbcoin::ValidatorKeys::createValidatorToken
            ((optional<jbcoin::ValidatorToken> *)local_c8,(ValidatorKeys *)local_70,&local_cc);
  bVar1 = boost::optional<jbcoin::ValidatorToken>::operator!
                    ((optional<jbcoin::ValidatorToken> *)local_c8);
  if (!bVar1) {
    jbcoin::ValidatorKeys::writeToFile((ValidatorKeys *)local_70,(path *)keys._88_8_);
    std::operator<<((ostream *)&std::cout,
                    "Update jbcoind.cfg file with these values and restart jbcoind:\n\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"# validator public key: ");
    pPVar4 = jbcoin::ValidatorKeys::publicKey((ValidatorKeys *)local_70);
    jbcoin::toBase58_abi_cxx11_
              ((string *)((long)&tokenStr.field_2 + 8),(jbcoin *)0x1c,(TokenType)pPVar4,in_RCX);
    poVar3 = std::operator<<(poVar3,(string *)(tokenStr.field_2._M_local_buf + 8));
    std::operator<<(poVar3,"\n\n");
    std::__cxx11::string::~string((string *)(tokenStr.field_2._M_local_buf + 8));
    std::operator<<((ostream *)&std::cout,"[validator_token]\n");
    this = boost::optional<jbcoin::ValidatorToken>::operator->
                     ((optional<jbcoin::ValidatorToken> *)local_c8);
    jbcoin::ValidatorToken::toString_abi_cxx11_((string *)&i,this);
    local_114 = 0x48;
    local_118 = 0;
    while( true ) {
      uVar5 = (ulong)local_118;
      uVar6 = std::__cxx11::string::size();
      if (uVar6 <= uVar5) break;
      std::__cxx11::string::substr((ulong)local_138,(ulong)&i);
      poVar3 = std::operator<<((ostream *)&std::cout,local_138);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_138);
      local_118 = local_118 + 0x48;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&i);
    boost::optional<jbcoin::ValidatorToken>::~optional((optional<jbcoin::ValidatorToken> *)local_c8)
    ;
    jbcoin::ValidatorKeys::~ValidatorKeys((ValidatorKeys *)local_70);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar2,
             "Maximum number of tokens have already been generated.\nRevoke validator keys if previous token has been compromised."
            );
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void createToken (boost::filesystem::path const& keyFile)
{
    using namespace jbcoin;

    auto keys = ValidatorKeys::make_ValidatorKeys (keyFile);

    if (keys.revoked ())
        throw std::runtime_error (
            "Validator keys have been revoked.");

    auto const token = keys.createValidatorToken ();

    if (! token)
        throw std::runtime_error (
            "Maximum number of tokens have already been generated.\n"
            "Revoke validator keys if previous token has been compromised.");

    // Update key file with new token sequence
    keys.writeToFile (keyFile);

    std::cout << "Update jbcoind.cfg file with these values and restart jbcoind:\n\n";
    std::cout << "# validator public key: " <<
        toBase58 (TOKEN_NODE_PUBLIC, keys.publicKey()) << "\n\n";
    std::cout << "[validator_token]\n";

    auto const tokenStr = token->toString();
    auto const len = 72;
    for (auto i = 0; i < tokenStr.size(); i += len)
        std::cout << tokenStr.substr(i, len) << std::endl;

    std::cout << std::endl;
}